

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_0::CopyImageToSSBOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CopyImageToSSBOTestInstance *this)

{
  VkDeviceSize bufferSize;
  long lVar1;
  long lVar2;
  void *pvVar3;
  ProgramCollection<vk::ProgramBinary> *this_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Allocation *pAVar4;
  deUint32 dVar5;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  IVec2 *a;
  DescriptorSetLayoutBuilder *pDVar6;
  DescriptorPoolBuilder *pDVar7;
  DescriptorSetUpdateBuilder *pDVar8;
  ProgramBinary *binary;
  ostream *poVar9;
  long lVar10;
  uint uVar11;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_598;
  CopyImageToSSBOTestInstance *local_578;
  deUint32 local_56c;
  Allocator *local_568;
  IVec2 workSize;
  VkImageMemoryBarrier imagePostCopyBarrier;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_4e8;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined4 local_498;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined4 local_478;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_468;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_448;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkDescriptorImageInfo imageDescriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_3f8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_3d8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3b8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_398;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_378;
  Buffer stagingBuffer;
  Buffer outputBuffer;
  Image image;
  Random rnd;
  VkBufferMemoryBarrier stagingBufferPostHostWriteBarrier;
  RefBase<vk::VkCommandBuffer_s_*> local_118;
  VkBufferMemoryBarrier computeFinishBarrier;
  VkBufferImageCopy copyParams;
  VkImageCreateInfo imageParams;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_56c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_568 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = VK_FORMAT_R32_UINT;
  imageParams.extent._0_8_ = *(undefined8 *)(this->m_imageSize).m_data;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 10;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  Image::Image(&image,vk,device,local_568,&imageParams,(MemoryRequirement)0x0);
  local_488 = 1;
  uStack_480 = 1;
  local_478 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&rnd,vk,device,
                (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                         m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_UINT,subresourceRange);
  local_378.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_378.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_378.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&rnd);
  uVar11 = (this->m_imageSize).m_data[0] * (this->m_imageSize).m_data[1];
  bufferSize = (ulong)uVar11 * 4;
  local_578 = this;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,1);
  compute::Buffer::Buffer
            (&stagingBuffer,vk,device,local_568,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  deRandom_init(&rnd.m_rnd,0xab2c7);
  pAVar4 = stagingBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  a = &local_578->m_imageSize;
  pvVar3 = (stagingBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  for (lVar10 = 0; uVar11 != (uint)lVar10; lVar10 = lVar10 + 1) {
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    *(deUint32 *)((long)pvVar3 + lVar10 * 4) = dVar5;
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,bufferSize);
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&outputBuffer,vk,device,local_568,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar6,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&imagePostCopyBarrier,pDVar6,vk,device,0);
  local_448.m_data.deleter.m_device = (VkDevice)imagePostCopyBarrier._16_8_;
  local_448.m_data.deleter.m_allocator = (VkAllocationCallbacks *)imagePostCopyBarrier._24_8_;
  local_448.m_data.object.m_internal = imagePostCopyBarrier._0_8_;
  local_448.m_data.deleter.m_deviceIface = (DeviceInterface *)imagePostCopyBarrier.pNext;
  imagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePostCopyBarrier._4_4_ = 0;
  imagePostCopyBarrier.pNext = (void *)0x0;
  imagePostCopyBarrier.srcAccessMask = 0;
  imagePostCopyBarrier.dstAccessMask = 0;
  imagePostCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imagePostCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&imagePostCopyBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&imagePostCopyBarrier)
  ;
  pDVar7 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&imagePostCopyBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar7 = ::vk::DescriptorPoolBuilder::addType(pDVar7,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar7,vk,device,1,1);
  local_398.m_data.deleter.m_device = (VkDevice)0x0;
  local_398.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_398.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_398.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&rnd);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&imagePostCopyBarrier);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,vk,device,
                    (VkDescriptorPool)local_398.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_448.m_data.object.m_internal);
  local_4e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_4e8.m_data.deleter.m_pool.m_internal = 0;
  local_4e8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_4e8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_4e8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&rnd);
  imageDescriptorInfo.sampler.m_internal = 0;
  imageDescriptorInfo.imageView.m_internal = local_378.m_data.object.m_internal;
  imageDescriptorInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  bufferDescriptorInfo.buffer.m_internal =
       outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  bufferDescriptorInfo.offset = 0;
  bufferDescriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  imagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePostCopyBarrier._4_4_ = 0;
  pDVar8 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     ((DescriptorSetUpdateBuilder *)&rnd,
                      (VkDescriptorSet)local_4e8.m_data.object.m_internal,
                      (Location *)&imagePostCopyBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      &bufferDescriptorInfo);
  stagingBufferPostHostWriteBarrier.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  stagingBufferPostHostWriteBarrier._4_4_ = 0;
  pDVar8 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar8,(VkDescriptorSet)local_4e8.m_data.object.m_internal,
                      (Location *)&stagingBufferPostHostWriteBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&imageDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar8,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  this_00 = ((local_578->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imagePostCopyBarrier,"comp",
             (allocator<char> *)&stagingBufferPostHostWriteBarrier);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&imagePostCopyBarrier);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,vk,device,binary,0);
  local_3b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3b8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_3b8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&rnd);
  std::__cxx11::string::~string((string *)&imagePostCopyBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,vk,device,
                     (VkDescriptorSetLayout)local_448.m_data.object.m_internal);
  local_468.m_data.deleter.m_device = (VkDevice)0x0;
  local_468.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_468.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_468.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_468.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&rnd);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,vk,device,
                      (VkPipelineLayout)local_468.m_data.object.m_internal,
                      (VkShaderModule)local_3b8.m_data.object.m_internal);
  local_3d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_3d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3d8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_3d8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_3d8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&rnd);
  makeBufferMemoryBarrier
            (&stagingBufferPostHostWriteBarrier,0x4000,0x800,
             (VkBuffer)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  local_4a8 = 1;
  uStack_4a0 = 1;
  local_498 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&rnd,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  local_4c8 = 1;
  uStack_4c0 = 1;
  local_4b8 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&imagePostCopyBarrier,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  makeBufferMemoryBarrier
            (&computeFinishBarrier,0x40,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeBufferImageCopy(&copyParams,a);
  tcu::operator/((tcu *)&workSize,a,&local_578->m_localSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&local_598,vk,device,local_56c);
  local_3f8.m_data.deleter.m_device = local_598.m_data.deleter.m_device;
  local_3f8.m_data.deleter.m_allocator = local_598.m_data.deleter.m_allocator;
  local_3f8.m_data.object.m_internal = local_598.m_data.object.m_internal;
  local_3f8.m_data.deleter.m_deviceIface = local_598.m_data.deleter.m_deviceIface;
  local_598.m_data.object.m_internal = 0;
  local_598.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_598.m_data.deleter.m_device = (VkDevice)0x0;
  local_598.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_598);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_118,vk,device,
             (VkCommandPool)local_3f8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_598.m_data.deleter.m_device = local_118.m_data.deleter.m_device;
  local_598.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_118.m_data.deleter.m_pool.m_internal;
  local_598.m_data.object.m_internal = (deUint64)local_118.m_data.object;
  local_598.m_data.deleter.m_deviceIface = local_118.m_data.deleter.m_deviceIface;
  local_118.m_data.object = (VkCommandBuffer_s *)0x0;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_118.m_data.deleter.m_device = (VkDevice)0x0;
  local_118.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_118);
  beginCommandBuffer(vk,(VkCommandBuffer)local_598.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_598.m_data.object.m_internal,1,local_3d8.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_598.m_data.object.m_internal,1,local_468.m_data.object.m_internal,0,1,
             &local_4e8,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.m_data.object.m_internal,0x4000,0x1000,0,0,0,1,
             (int)&stagingBufferPostHostWriteBarrier,1,(VkImageMemoryBarrier *)&rnd);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,local_598.m_data.object.m_internal,
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,
             image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,7,
             1,&copyParams);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.m_data.object.m_internal,0x1000,1,0,0,0,0,0,1,&imagePostCopyBarrier);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_598.m_data.object.m_internal,(ulong)(uint)workSize.m_data[0],
             (ulong)(uint)workSize.m_data[1],1);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.m_data.object.m_internal,0x800,0x4000,0,0,0,1,(int)&computeFinishBarrier,0
             ,0);
  endCommandBuffer(vk,(VkCommandBuffer)local_598.m_data.object.m_internal);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)local_598.m_data.object.m_internal);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_598);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_3f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_3d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_468);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_3b8);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  lVar10 = -1;
  do {
    if (lVar10 - (ulong)uVar11 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,"Compute succeeded",(allocator<char> *)&imagePostCopyBarrier);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&rnd);
      std::__cxx11::string::~string((string *)&rnd);
      goto LAB_006c686c;
    }
    lVar1 = lVar10 * 4;
    lVar2 = lVar10 * 4;
    lVar10 = lVar10 + 1;
  } while (*(int *)((long)(outputBuffer.m_allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr)->m_hostPtr + lVar1 + 4) ==
           *(int *)((long)(stagingBuffer.m_allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr)->m_hostPtr + lVar2 + 4));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
  poVar9 = std::operator<<((ostream *)&rnd,"Comparison failed for Output.values[");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::operator<<(poVar9,"]");
  std::__cxx11::stringbuf::str();
  tcu::TestStatus::fail(__return_storage_ptr__,(string *)&imagePostCopyBarrier);
  std::__cxx11::string::~string((string *)&imagePostCopyBarrier);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
LAB_006c686c:
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_4e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_398);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_448);
  compute::Buffer::~Buffer(&outputBuffer);
  compute::Buffer::~Buffer(&stagingBuffer);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_378);
  Image::~Image(&image);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus CopyImageToSSBOTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Staging buffer (source data for image)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * imageArea;

	const Buffer stagingBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	// Populate the staging buffer with test data
	{
		de::Random rnd(0xab2c7);
		const Allocation& stagingBufferAllocation = stagingBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(stagingBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < imageArea; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, stagingBufferAllocation.getMemory(), stagingBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create a buffer to store shader output

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, bufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier stagingBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, *stagingBuffer, 0ull, bufferSizeBytes);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			0u, VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePostCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier computeFinishBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);
		const tcu::IVec2 workSize = m_imageSize / m_localSize;

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &stagingBufferPostHostWriteBarrier, 1, &imagePreCopyBarrier);
		vk.cmdCopyBufferToImage(*cmdBuffer, *stagingBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePostCopyBarrier);

		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), 1u);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &computeFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(stagingBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < imageArea; ++ndx)
	{
		const deUint32 res = *(bufferPtr + ndx);
		const deUint32 ref = *(refBufferPtr + ndx);

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for Output.values[" << ndx << "]";
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}